

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O2

void serialization::
     serialize_container_helper<serialization::json_oarchive,std::map<std::__cxx11::string,Person,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>>
               (json_oarchive *ar,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
               *v)

{
  _Base_ptr p_Var1;
  
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(&ar->writer_);
  for (p_Var1 = (v->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(v->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    serialize_helper<serialization::json_oarchive,std::__cxx11::string_const,Person>
              (ar,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
                   *)(p_Var1 + 1));
  }
  json_oarchive::save_sequence_end(ar);
  return;
}

Assistant:

inline void serialize_container_helper(Archive & ar, const T & v)
{
    serialization_trace trace(__func__, __FILE__, __LINE__);

    ar.save_sequence_start(v.size());
    for(const auto & i : v)
    {
        ar.save_sequence_item_start();
        serialize_helper(ar, i);
        ar.save_sequence_item_end();
    }
    ar.save_sequence_end();
}